

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanNMTOKEN(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  uint uVar2;
  Category CVar3;
  uint *puVar4;
  long lVar5;
  ushort uc;
  long from;
  QStringView s;
  
  lVar5 = 0;
  do {
    uVar2 = getChar(this);
    if (uVar2 == 0xffffffff) {
      lVar1 = (this->textBuffer).d.size;
      from = lVar1 - lVar5;
      s.m_data = (this->textBuffer).d.ptr;
      s.m_size = lVar1;
      putString(this,s,from);
      QString::resize(&this->textBuffer,from);
      return lVar5;
    }
    if ((ushort)(char16_t)uVar2 < 0x80) {
      if ("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          [uVar2 & 0x7f] == '\x02') {
LAB_0035a1d0:
        puVar4 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
        *puVar4 = uVar2;
        return lVar5;
      }
    }
    else {
      CVar3 = QChar::category(uVar2 & 0xffff);
      if ((Letter_Other < CVar3) ||
         ((0x7c03fU >> (CVar3 & (Symbol_Modifier|Number_DecimalDigit)) & 1) == 0))
      goto LAB_0035a1d0;
    }
    lVar5 = lVar5 + 1;
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar2);
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanNMTOKEN()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        if (fastDetermineNameChar(QChar(c)) == NotName) {
            putChar(c);
            return n;
        } else {
            ++n;
            textBuffer += QChar(c);
        }
    }

    qsizetype pos = textBuffer.size() - n;
    putString(textBuffer, pos);
    textBuffer.resize(pos);

    return n;
}